

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

uint8_t get_mask(int field)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint8_t uVar5;
  byte bVar6;
  int iVar7;
  uint in_ECX;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint extraout_EDX;
  m256v *M;
  m256v *M_00;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  m256v *pmVar14;
  uint in_ESI;
  int *cp;
  uint8_t *memory;
  uint8_t *puVar15;
  int *inverted_out;
  m256v mStack_170;
  m256v mStack_158;
  m256v mStack_140;
  m256v mStack_128;
  m256v mStack_110;
  m256v mStack_f8;
  uint8_t *puStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  undefined8 uStack_a8;
  int *piStack_a0;
  int *piStack_98;
  uint8_t *puStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  undefined1 *puStack_70;
  ulong uStack_68;
  uint uStack_5c;
  ulong uStack_58;
  int iStack_4c;
  ulong uStack_48;
  uint uStack_3c;
  
  uVar5 = '\x01';
  if (field != 2) {
    if (field != 0x100) {
      get_mask_cold_1();
      uVar12 = (ulong)extraout_EDX;
      uStack_5c = in_ECX;
      bVar6 = get_mask(in_ECX);
      uVar9 = (ulong)(extraout_EDX * in_ESI);
      uStack_88 = (ulong)extraout_EDX;
      if ((int)extraout_EDX < (int)in_ESI) {
        uStack_88 = (ulong)in_ESI;
      }
      if (field == 0) {
        uStack_88 = (ulong)extraout_EDX;
      }
      uStack_d0 = (ulong)(uint)((int)uStack_88 * 8);
      uStack_c8 = (ulong)(in_ESI * 8);
      uStack_c0 = (ulong)in_ESI;
      uStack_a8 = 0;
      uStack_80 = uVar9 + 0xf & 0xfffffffffffffff0;
      uStack_b8 = uStack_d0 + 0xf & 0xfffffffffffffff0;
      uStack_78 = uStack_c8 + 0xf & 0xfffffffffffffff0;
      uStack_b0 = (ulong)extraout_EDX * 4 + 0xf & 0xfffffffffffffff0;
      uStack_68 = 0;
      pmVar14 = &mStack_170;
      uStack_58 = uVar9;
      iStack_4c = field;
      uStack_48 = (ulong)in_ESI;
      uStack_3c = extraout_EDX;
      while( true ) {
        lVar1 = -uStack_80;
        puVar15 = (uint8_t *)((long)pmVar14 + lVar1);
        puStack_70 = (undefined1 *)pmVar14;
        if (0 < (int)uVar9) {
          uVar11 = 0;
          do {
            builtin_memcpy((uint8_t *)((long)pmVar14 + lVar1 + -8),"%\x1c\x10",4);
            puVar15[-4] = '\0';
            puVar15[-3] = '\0';
            puVar15[-2] = '\0';
            puVar15[-1] = '\0';
            iVar7 = rand();
            puVar15[uVar11] = (byte)iVar7 & bVar6;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        uVar9 = uStack_48;
        builtin_memcpy((uint8_t *)((long)pmVar14 + lVar1 + -8),"J\x1c\x10",4);
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        m256v_make(&mStack_128,(int)uVar9,(int)uVar12,puVar15);
        uVar9 = uStack_d0;
        lVar2 = -uStack_b8;
        memory = puVar15 + lVar2;
        if (0 < (int)uStack_88) {
          uVar12 = 0;
          do {
            builtin_memcpy((uint8_t *)((long)pmVar14 + lVar2 + lVar1 + -8),"k\x1c\x10",4);
            memory[-4] = '\0';
            memory[-3] = '\0';
            memory[-2] = '\0';
            memory[-1] = '\0';
            iVar7 = rand();
            memory[uVar12] = (byte)iVar7 & bVar6;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        uVar9 = uStack_88;
        memory[-8] = 0x92;
        memory[-7] = '\x1c';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_make(&mStack_140,(int)uVar9,8,memory);
        uVar8 = uStack_3c;
        memory[-8] = 0xa9;
        memory[-7] = '\x1c';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_make(&mStack_110,uVar8,8,memory);
        lVar3 = -uStack_78;
        puVar10 = memory + lVar3;
        iVar7 = (int)uStack_48;
        puStack_e0 = puVar10;
        puVar10[-8] = 0xd5;
        puVar10[-7] = '\x1c';
        puVar10[-6] = '\x10';
        puVar10[-5] = '\0';
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_make(&mStack_170,iVar7,8,puVar10);
        puVar10[-8] = 0xeb;
        puVar10[-7] = '\x1c';
        puVar10[-6] = '\x10';
        puVar10[-5] = '\0';
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_mul(&mStack_128,&mStack_110,&mStack_170);
        uVar8 = uStack_3c;
        lVar4 = -uStack_80;
        puVar10 = puVar10 + lVar4;
        builtin_memcpy((uint8_t *)((long)pmVar14 + lVar4 + lVar3 + lVar2 + lVar1 + -8),"\n\x1d\x10",
                       4);
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_make(&mStack_f8,iVar7,uVar8,puVar10);
        uVar9 = uStack_58;
        builtin_memcpy((uint8_t *)((long)pmVar14 + lVar4 + lVar3 + lVar2 + lVar1 + -8),
                       "\x19\x1d\x10",4);
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        memcpy(puVar10,puVar15,uVar9);
        uStack_d8 = uStack_c0 * 4 + 0xf & 0xfffffffffffffff0;
        piVar13 = (int *)(puVar10 + -uStack_d8);
        cp = (int *)((long)piVar13 - uStack_b0);
        cp[-2] = 0x101d5b;
        cp[-1] = 0;
        m256v_LU_decomp_inplace(&mStack_f8,piVar13,cp);
        puVar15 = (uint8_t *)((long)cp - uStack_78);
        iVar7 = (int)uStack_48;
        piStack_a0 = cp;
        piStack_98 = piVar13;
        if ((byte)iStack_4c == '\0') {
          puVar15[-8] = 0xda;
          puVar15[-7] = '\x1d';
          puVar15[-6] = '\x10';
          puVar15[-5] = '\0';
          puVar15[-4] = '\0';
          puVar15[-3] = '\0';
          puVar15[-2] = '\0';
          puVar15[-1] = '\0';
          m256v_make(&mStack_158,iVar7,8,puVar15);
          puVar15[-8] = 0xf6;
          puVar15[-7] = '\x1d';
          puVar15[-6] = '\x10';
          puVar15[-5] = '\0';
          puVar15[-4] = '\0';
          puVar15[-3] = '\0';
          puVar15[-2] = '\0';
          puVar15[-1] = '\0';
          m256v_LU_mult(&mStack_f8,piVar13,cp,&mStack_110,&mStack_158);
          uVar9 = uStack_58;
          memory = puVar15;
        }
        else {
          inverted_out = (int *)(puVar15 + -uStack_d8);
          puStack_90 = puVar15;
          inverted_out[-2] = 0x101d99;
          inverted_out[-1] = 0;
          perm_invert(iVar7,piVar13,inverted_out);
          uVar9 = uStack_58;
          inverted_out[-2] = 0x101db6;
          inverted_out[-1] = 0;
          m256v_LU_mult_inplace(&mStack_f8,inverted_out,cp,&mStack_140);
          puVar15 = puStack_90;
        }
        uVar12 = uStack_c8;
        puVar10 = puStack_e0;
        builtin_memcpy(puVar15 + -8,"\x10\x1e\x10",4);
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        iVar7 = bcmp(puVar10,memory,uVar12);
        uVar12 = (ulong)uStack_3c;
        if (iVar7 != 0) break;
        uVar8 = (uint)uStack_68 + 1;
        uStack_a8 = CONCAT71((int7)(uStack_68 >> 8),0x270e < (uint)uStack_68);
        uStack_68 = (ulong)uVar8;
        pmVar14 = (m256v *)puStack_70;
        if (uVar8 == 10000) {
LAB_00101e39:
          return (byte)uStack_a8 & 1;
        }
      }
      uVar11 = (ulong)(byte)iStack_4c;
      iVar7 = (int)uStack_48;
      uVar9 = uStack_48 & 0xffffffff;
      *(ulong *)(puVar15 + -0x10) = uStack_68;
      puVar15[-0x18] = '{';
      puVar15[-0x17] = '\x1e';
      puVar15[-0x16] = '\x10';
      puVar15[-0x15] = '\0';
      puVar15[-0x14] = '\0';
      puVar15[-0x13] = '\0';
      puVar15[-0x12] = '\0';
      puVar15[-0x11] = '\0';
      fprintf(_stderr,"Error:  A*X != PLUQ*X. (inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
              uVar11,uVar9,uVar12,(ulong)uStack_5c);
      puVar15[-8] = 0x98;
      puVar15[-7] = '\x1e';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        Details about the test case:\n",0x25,1,_stderr);
      puVar15[-8] = 0xb1;
      puVar15[-7] = '\x1e';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        rp = ",0xd,1,_stderr);
      piVar13 = piStack_98;
      puVar15[-8] = 0xc3;
      puVar15[-7] = '\x1e';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_int_arr((FILE *)_stderr,iVar7,piVar13);
      puVar15[-8] = 0xdc;
      puVar15[-7] = '\x1e';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        cp = ",0xd,1,_stderr);
      piVar13 = piStack_a0;
      puVar15[-8] = 0xee;
      puVar15[-7] = '\x1e';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_int_arr((FILE *)_stderr,uStack_3c,piVar13);
      puVar15[-8] = '\a';
      puVar15[-7] = '\x1f';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        matrix A:\n",0x12,1,_stderr);
      puVar15[-8] = '\x16';
      puVar15[-7] = '\x1f';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&mStack_128,M);
      puVar15[-8] = '/';
      puVar15[-7] = '\x1f';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        matrix LU:\n",0x13,1,_stderr);
      puVar15[-8] = '>';
      puVar15[-7] = '\x1f';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&mStack_f8,M_00);
      goto LAB_00101e39;
    }
    uVar5 = 0xff;
  }
  return uVar5;
}

Assistant:

UNUSED
static uint8_t get_mask(int field)
{
	switch(field) {
	case 2:		return 0x1;	break;
	case 256:	return 0xff;	break;
	default:
		fprintf(stderr, "%s:%d: Unsupported field size %d.\n",
			__FILE__, __LINE__, field);
		exit(EXIT_FAILURE);
	}
	return 0; // Not reached.
}